

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

ssh_cipher * ccp_new(ssh_cipheralg *alg)

{
  void *pvVar1;
  ccp_context *ctx;
  ssh_cipheralg *alg_local;
  
  pvVar1 = safemalloc(1,0x1a0,0);
  *(code **)((long)pvVar1 + 0x170) = poly_BinarySink_write;
  *(undefined8 *)((long)pvVar1 + 0x178) = 0;
  *(long *)((long)pvVar1 + 0x180) = (long)pvVar1 + 0x170;
  poly1305_init((poly1305 *)((long)pvVar1 + 0x118));
  *(ssh_cipheralg **)((long)pvVar1 + 0x188) = alg;
  return (ssh_cipher *)((long)pvVar1 + 0x188);
}

Assistant:

static ssh_cipher *ccp_new(const ssh_cipheralg *alg)
{
    struct ccp_context *ctx = snew(struct ccp_context);
    BinarySink_INIT(ctx, poly_BinarySink_write);
    poly1305_init(&ctx->mac);
    ctx->ciph.vt = alg;
    return &ctx->ciph;
}